

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPServer.cpp
# Opt level: O1

ssize_t __thiscall
SocketPP::TCPServer::send(TCPServer *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  int iVar2;
  __normal_iterator<const_SocketPP::TCPStream_*,_std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>_>
  this_00;
  ssize_t sVar3;
  size_t __n_00;
  undefined4 in_register_00000034;
  Message *pMVar4;
  
  pMVar4 = (Message *)CONCAT44(in_register_00000034,__fd);
  if ((this->super_SocketServer).super_Socket.field_0xc == '\0') {
    printf("\x1b[31mERROR: %s: %s: %d: not inited!\x1b[m\n","TCPServer.cpp","send",0x1b);
    return -2;
  }
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->streamMutex_);
  if (iVar2 == 0) {
    __n_00 = (pMVar4->rawMsg).len_;
    printf("\x1b[33m%s: TCPServer::send: target=%d, len=%ld\x1b[m\n","TCPServer.cpp",
           (ulong)(uint)(pMVar4->target).fd);
    if (((this->sendInterceptor_).super__Function_base._M_manager == (_Manager_type)0x0) ||
       (bVar1 = (*(this->sendInterceptor_)._M_invoker)((_Any_data *)&this->sendInterceptor_,pMVar4),
       !bVar1)) {
      this_00 = std::
                __find_if<__gnu_cxx::__normal_iterator<SocketPP::TCPStream_const*,std::vector<SocketPP::TCPStream,std::allocator<SocketPP::TCPStream>>>,__gnu_cxx::__ops::_Iter_equals_val<SocketPP::TCPStream_const>>
                          ((this->connectedStreams_).
                           super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           (this->connectedStreams_).
                           super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>
                           ._M_impl.super__Vector_impl_data._M_finish,pMVar4);
      if (this_00._M_current ==
          (this->connectedStreams_).
          super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        printf("\x1b[31mERROR: %s: %s: %d: StreamNotFound\x1b[m\n","TCPServer.cpp","send",0x28);
        sVar3 = -3;
      }
      else {
        if ((this->sendHandle_).super__Function_base._M_manager != (_Manager_type)0x0) {
          (*(this->sendHandle_)._M_invoker)((_Any_data *)&this->sendHandle_,pMVar4);
        }
        printf("\x1b[33m%s: try to send to stream:%d\x1b[m\n","TCPServer.cpp",
               (ulong)(uint)(this_00._M_current)->fd);
        sVar3 = TCPStream::send(this_00._M_current,(int)(pMVar4->rawMsg).data_,
                                (void *)(pMVar4->rawMsg).len_,__n_00,__flags);
        if (sVar3 == -1) {
          printf("\x1b[31mERROR: %s: %s: %d: send failed!\x1b[m\n","TCPServer.cpp","send",0x34);
        }
        else {
          printf("\x1b[33m%s: send success! len:%ld\x1b[m\n","TCPServer.cpp",sVar3);
        }
      }
    }
    else {
      sVar3 = 0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->streamMutex_);
    return sVar3;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

ssize_t TCPServer::send(const Message& message) {
    if (!started_) {
        LOGE("not inited!");
        return SendResult::SocketNotInited;
    }

    std::lock_guard<std::mutex> lockStream(streamMutex_);
    LOGD("TCPServer::send: target=%d, len=%ld", message.target.fd, message.rawMsg.length());

    if (sendInterceptor_) {
        if (sendInterceptor_(message)) return SendResult::Intercepted;
    }

    const auto& iter = std::find(connectedStreams_.cbegin(), connectedStreams_.cend(), message.target);
    if (iter == connectedStreams_.cend()) {
        LOGE("StreamNotFound");
        return StreamNotFound;
    }

    const auto& stream = *iter;
    onSend(stream, message);

    LOGD("try to send to stream:%d", stream.fd);
    const auto& rawMsg = message.rawMsg;
    ssize_t ret = stream.send(rawMsg.data(), rawMsg.length());

    if (ret == -1) {
        LOGE("send failed!");
    } else {
        LOGD("send success! len:%ld", ret);
    }

    return ret;
}